

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O3

void printMemOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  cs_detail *pcVar5;
  MCOperand *op;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined4 in_register_00000034;
  char *pcVar10;
  undefined1 *puVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  
  op = MCInst_getOperand(MI,1);
  uVar6 = MCOperand_getImm(op);
  uVar13 = (uint)(uVar6 >> 0xc) & 0x7f;
  uVar15 = (uint)(uVar6 >> 5) & 0x7f;
  uVar14 = (uint)(uVar6 >> 1) & 0xf;
  bVar16 = (uVar6 >> 0x13 & 1) == 0;
  uVar7 = 0x5b;
  if (bVar16) {
    uVar7 = 0x28;
  }
  uVar12 = 0x5d;
  if (bVar16) {
    uVar12 = 0x29;
  }
  switch(uVar14) {
  case 0:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*-%s%c%u%c";
    break;
  case 1:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*+%s%c%u%c";
    break;
  default:
    goto switchD_00266455_caseD_2;
  case 4:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*-%s%c%s%c";
    goto LAB_00266664;
  case 5:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*+%s%c%s%c";
    goto LAB_00266664;
  case 8:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*--%s%c%u%c";
    break;
  case 9:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*++%s%c%u%c";
    break;
  case 10:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*%s--%c%u%c";
    break;
  case 0xb:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*%s++%c%u%c";
    break;
  case 0xc:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*--%s%c%s%c";
    goto LAB_00266664;
  case 0xd:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*++%s%c%s%c";
    goto LAB_00266664;
  case 0xe:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*%s--%c%s%c";
    goto LAB_00266664;
  case 0xf:
    puVar8 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*%s++%c%s%c";
LAB_00266664:
    SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),pcVar10,puVar8,uVar7,puVar11,
                   uVar12);
    goto switchD_00266455_caseD_2;
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),pcVar10,puVar8,uVar7,(ulong)uVar15,
                 uVar12);
switchD_00266455_caseD_2:
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar5 = MI->flat_insn->detail;
    bVar2 = (pcVar5->field_6).x86.prefix[0];
    lVar9 = (ulong)bVar2 * 0x20;
    puVar1 = pcVar5->groups + lVar9 + 0x11;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(pcVar5->groups + lVar9 + 0x15) = uVar13;
    *(uint *)(pcVar5->groups + lVar9 + 0x19) = uVar15;
    *(uint *)(pcVar5->groups + lVar9 + 0x1d) = ((uint)uVar6 & 1) + 1;
    *(uint *)(pcVar5->groups + lVar9 + 0x21) = (uint)(uVar6 >> 0x13) & 1;
    if ((0xff33U >> uVar14 & 1) != 0) {
      uVar14 = uVar14 << 2;
      uVar3 = *(undefined4 *)(&DAT_00588434 + uVar14);
      uVar4 = *(undefined4 *)(&DAT_00588474 + uVar14);
      lVar9 = (ulong)bVar2 * 0x20;
      *(undefined4 *)(pcVar5->groups + lVar9 + 0x25) = *(undefined4 *)(&DAT_005883f4 + uVar14);
      *(undefined4 *)(pcVar5->groups + lVar9 + 0x29) = uVar3;
      *(undefined4 *)(pcVar5->groups + lVar9 + 0x2d) = uVar4;
    }
    (pcVar5->field_6).x86.prefix[0] = bVar2 + 1;
  }
  return;
}

Assistant:

static void printMemOperand(MCInst *MI, int opNum, SStream *O)
{
	// Load/Store memory operands -- imm($reg)
	// If PIC target the target is loaded as the
	// pattern lw $25,%call16($28)

	// opNum can be invalid if instruction had reglist as operand.
	// MemOperand is always last operand of instruction (base + offset).
	switch (MCInst_getOpcode(MI)) {
		default:
			break;
		case Mips_SWM32_MM:
		case Mips_LWM32_MM:
		case Mips_SWM16_MM:
		case Mips_LWM16_MM:
			opNum = MCInst_getNumOperands(MI) - 2;
			break;
	}

	set_mem_access(MI, true);
	printOperand(MI, opNum + 1, O);
	SStream_concat0(O, "(");
	printOperand(MI, opNum, O);
	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}